

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MoiraExec_cpp.h
# Opt level: O2

void __thiscall
moira::Moira::execDivsMusashi<(moira::Core)1,(moira::Instr)54,(moira::Mode)0,2>
          (Moira *this,u16 opcode,bool *divByZero)

{
  ushort uVar1;
  u32 uVar2;
  ulong uVar3;
  
  uVar1 = *(ushort *)((long)&(this->reg).field_3 + (ulong)(opcode & 7) * 4);
  if (uVar1 != 0) {
    uVar3 = (ulong)(opcode >> 9 & 7);
    uVar2 = divsMusashi<(moira::Core)1>
                      (this,*(u32 *)((long)&(this->reg).field_3 + uVar3 * 4),(uint)uVar1);
    *(u32 *)((long)&(this->reg).field_3 + uVar3 * 4) = uVar2;
    prefetch<(moira::Core)1,4ull>(this);
    return;
  }
  execException<(moira::Core)1>(this,DIVIDE_BY_ZERO,0);
  *divByZero = true;
  return;
}

Assistant:

void
Moira::execDivsMusashi(u16 opcode, bool *divByZero)
{
    int src = _____________xxx(opcode);
    int dst = ____xxx_________(opcode);

    [[maybe_unused]] i64 c = clock;

    u32 ea, divisor, result;
    readOp<C, M, Word>(src, &ea, &divisor);

    if (divisor == 0) {

        if constexpr (C == Core::C68000) {
            SYNC(8 - (int)(clock - c));
        } else {
            SYNC(10 - (int)(clock - c));
        }
        execException<C>(M68kException::DIVIDE_BY_ZERO);
        *divByZero = true;
        return;
    }

    u32 dividend = readD(dst);
    result = divsMusashi<C>(dividend, divisor);

    SYNC_68000(154);
    SYNC_68010(118);

    writeD(dst, result);
    prefetch<C, POLL>();
}